

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O3

uint64_t pstore::repo::fragment::
         section_offset_is_valid<(pstore::repo::section_kind)12,pstore::repo::generic_section>
                   (fragment *f,extent<pstore::repo::fragment> *fext,uint64_t min_offset,
                   uint64_t offset,size_t size)

{
  uint64_t uVar1;
  size_t sVar2;
  
  uVar1 = 0;
  if (((min_offset <= offset) && (0xf < size)) &&
     (((int)(fext->addr).a_.a_ + (int)offset & 7U) == 0)) {
    if (fext->size - size < offset || fext->size < size) {
      uVar1 = 0;
    }
    else {
      sVar2 = generic_section::size_bytes((generic_section *)((f->signature_)._M_elems + offset));
      uVar1 = 0;
      if (sVar2 <= size) {
        uVar1 = offset + size;
      }
    }
  }
  return uVar1;
}

Assistant:

std::uint64_t
fragment::section_offset_is_valid (fragment const & f, pstore::extent<fragment> const & fext,
                                   std::uint64_t const min_offset, std::uint64_t const offset,
                                   std::size_t const size) {
    PSTORE_STATIC_ASSERT (alignof (fragment) >= alignof (InstanceType));
    return ((fext.addr.absolute () + offset) % alignof (InstanceType) != 0 ||
            size < sizeof (InstanceType) || offset < min_offset || size > fext.size ||
            offset > fext.size - size ||
            f.offset_to_instance<InstanceType> (offset).size_bytes () > size)
               ? 0
               : offset + size;
}